

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O1

AggregateFunction *
duckdb::ApproxQuantileDecimalListFunction
          (AggregateFunction *__return_storage_ptr__,LogicalType *type)

{
  GetApproxQuantileListAggregateFunction(__return_storage_ptr__,type);
  ::std::__cxx11::string::_M_replace
            ((ulong)&(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.
                     super_Function.name,0,
             (char *)(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.
                     super_Function.name._M_string_length,0x1e2a281);
  __return_storage_ptr__->serialize = ApproximateQuantileBindData::Serialize;
  __return_storage_ptr__->deserialize = ApproximateQuantileBindData::Deserialize;
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction ApproxQuantileDecimalListFunction(const LogicalType &type) {
	auto function = GetApproxQuantileListAggregateFunction(type);
	function.name = "approx_quantile";
	function.serialize = ApproximateQuantileBindData::Serialize;
	function.deserialize = ApproximateQuantileBindData::Deserialize;
	return function;
}